

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O1

Hop_Obj_t * Hop_IthVar(Hop_Man_t *p,int i)

{
  int iVar1;
  
  if (p->nObjs[2] <= i) {
    iVar1 = (i - p->nObjs[2]) + 1;
    do {
      Hop_ObjCreatePi(p);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (i < p->vPis->nSize) {
    if (-1 < i) {
      return (Hop_Obj_t *)p->vPis->pArray[(uint)i];
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("i < Vec_PtrSize(p->vPis)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopOper.c"
                ,0x44,"Hop_Obj_t *Hop_IthVar(Hop_Man_t *, int)");
}

Assistant:

Hop_Obj_t * Hop_IthVar( Hop_Man_t * p, int i )
{
    int v;
    for ( v = Hop_ManPiNum(p); v <= i; v++ )
        Hop_ObjCreatePi( p );
    assert( i < Vec_PtrSize(p->vPis) );
    return Hop_ManPi( p, i );
}